

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.hpp
# Opt level: O2

void __thiscall elf_parser::Elf_parser::~Elf_parser(Elf_parser *this)

{
  std::__cxx11::string::~string((string *)&this->_last_error);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Elf_parser (const std::string &program_path): 
		m_program_path{program_path},
		_failed(false)
	{   
            load_memory_map();
        }